

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

void vorbis_init(stb_vorbis *p,stb_vorbis_alloc *z)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  
  SDL_memset(p,0,0x720);
  if (z != (stb_vorbis_alloc *)0x0) {
    iVar1 = z->alloc_buffer_length_in_bytes;
    uVar2 = *(undefined4 *)&z->field_0xc;
    (p->alloc).alloc_buffer = z->alloc_buffer;
    (p->alloc).alloc_buffer_length_in_bytes = iVar1;
    *(undefined4 *)&(p->alloc).field_0xc = uVar2;
    uVar3 = (p->alloc).alloc_buffer_length_in_bytes & 0xfffffff8;
    (p->alloc).alloc_buffer_length_in_bytes = uVar3;
    p->temp_offset = uVar3;
  }
  p->eof = 0;
  p->error = VORBIS__no_error;
  p->stream = (uint8 *)0x0;
  p->codebooks = (Codebook *)0x0;
  p->page_crc_tests = -1;
  p->close_on_free = 0;
  p->f = (FAudioIOStream *)0x0;
  return;
}

Assistant:

static void vorbis_init(stb_vorbis *p, const stb_vorbis_alloc *z)
{
   memset(p, 0, sizeof(*p)); // NULL out all malloc'd pointers to start
   if (z) {
      p->alloc = *z;
      p->alloc.alloc_buffer_length_in_bytes &= ~7;
      p->temp_offset = p->alloc.alloc_buffer_length_in_bytes;
   }
   p->eof = 0;
   p->error = VORBIS__no_error;
   p->stream = NULL;
   p->codebooks = NULL;
   p->page_crc_tests = -1;
   #ifndef STB_VORBIS_NO_STDIO
   p->close_on_free = FALSE;
   p->f = NULL;
   #endif
}